

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O1

void x25519_ge_scalarmult_base(ge_p3 *h,uint8_t *a)

{
  ge_p1p1 *r_00;
  byte bVar1;
  uint32_t uVar2;
  long lVar3;
  char cVar4;
  char cVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  char e [64];
  ge_p1p1 r;
  ge_p2 s;
  ge_precomp t;
  byte abStack_208 [64];
  ge_p1p1 local_1c8;
  ge_p2 local_128;
  ge_precomp local_a8;
  
  uVar2 = OPENSSL_get_ia32cap(2);
  if ((~uVar2 & 0x80108) == 0) {
    x25519_ge_scalarmult_base_adx((uint8_t (*) [32])(abStack_208 + 0x40),a);
    uVar8 = ((ulong)(byte)local_1c8.X.v[0] |
             (ulong)local_1c8.X.v[0]._2_1_ << 0x10 |
             (ulong)local_1c8.X.v[0]._3_1_ << 0x18 |
             (ulong)local_1c8.X.v[0]._4_1_ << 0x20 | (ulong)local_1c8.X.v[0]._5_1_ << 0x28 |
            (ulong)local_1c8.X.v[0]._1_1_ << 8) + ((ulong)local_1c8.X.v[0]._6_1_ << 0x30);
    uVar9 = (uVar8 >> 0x33) +
            ((ulong)local_1c8.X.v[0]._7_1_ << 5 |
            (ulong)(byte)local_1c8.X.v[1] << 0xd |
            (ulong)local_1c8.X.v[1]._1_1_ << 0x15 |
            (ulong)local_1c8.X.v[1]._2_1_ << 0x1d |
            (ulong)local_1c8.X.v[1]._3_1_ << 0x25 | (ulong)local_1c8.X.v[1]._4_1_ << 0x2d);
    uVar6 = ((ulong)local_1c8.X.v[1]._6_1_ << 10 |
            (ulong)local_1c8.X.v[1]._7_1_ << 0x12 |
            (ulong)(byte)local_1c8.X.v[2] << 0x1a |
            (ulong)local_1c8.X.v[2]._1_1_ << 0x22 |
            (ulong)local_1c8.X.v[2]._2_1_ << 0x2a | (ulong)local_1c8.X.v[2]._3_1_ << 0x32) +
            (ulong)local_1c8.X.v[1]._5_1_ * 4 + (uVar9 >> 0x33);
    uVar7 = (uVar6 >> 0x33 & 0xff) +
            ((ulong)local_1c8.X.v[2]._4_1_ << 7 |
            (ulong)local_1c8.X.v[2]._5_1_ << 0xf |
            (ulong)local_1c8.X.v[2]._6_1_ << 0x17 |
            (ulong)local_1c8.X.v[2]._7_1_ << 0x1f |
            (ulong)(byte)local_1c8.X.v[3] << 0x27 | (ulong)local_1c8.X.v[3]._1_1_ << 0x2f);
    (h->X).v[0] = uVar8 & 0x7ffffffffffff;
    (h->X).v[1] = uVar9 & 0x7ffffffffffff;
    (h->X).v[2] = uVar6 & 0x7ffffffffffff;
    (h->X).v[3] = uVar7 & 0x7ffffffffffff;
    (h->X).v[4] = (uVar7 >> 0x33) +
                  ((ulong)local_1c8.X.v[3]._2_1_ << 4 |
                  (ulong)local_1c8.X.v[3]._3_1_ << 0xc |
                  (ulong)local_1c8.X.v[3]._4_1_ << 0x14 |
                  (ulong)local_1c8.X.v[3]._5_1_ << 0x1c |
                  (ulong)local_1c8.X.v[3]._6_1_ << 0x24 | (ulong)local_1c8.X.v[3]._7_1_ << 0x2c);
    uVar8 = ((ulong)(byte)local_1c8.X.v[4] |
             (ulong)local_1c8.X.v[4]._2_1_ << 0x10 |
             (ulong)local_1c8.X.v[4]._3_1_ << 0x18 |
             (ulong)local_1c8.X.v[4]._4_1_ << 0x20 | (ulong)local_1c8.X.v[4]._5_1_ << 0x28 |
            (ulong)local_1c8.X.v[4]._1_1_ << 8) + ((ulong)local_1c8.X.v[4]._6_1_ << 0x30);
    uVar9 = (uVar8 >> 0x33) +
            ((ulong)local_1c8.X.v[4]._7_1_ << 5 |
            (ulong)(byte)local_1c8.Y.v[0] << 0xd |
            (ulong)local_1c8.Y.v[0]._1_1_ << 0x15 |
            (ulong)local_1c8.Y.v[0]._2_1_ << 0x1d |
            (ulong)local_1c8.Y.v[0]._3_1_ << 0x25 | (ulong)local_1c8.Y.v[0]._4_1_ << 0x2d);
    uVar6 = ((ulong)local_1c8.Y.v[0]._6_1_ << 10 |
            (ulong)local_1c8.Y.v[0]._7_1_ << 0x12 |
            (ulong)(byte)local_1c8.Y.v[1] << 0x1a |
            (ulong)local_1c8.Y.v[1]._1_1_ << 0x22 |
            (ulong)local_1c8.Y.v[1]._2_1_ << 0x2a | (ulong)local_1c8.Y.v[1]._3_1_ << 0x32) +
            (ulong)local_1c8.Y.v[0]._5_1_ * 4 + (uVar9 >> 0x33);
    uVar7 = (uVar6 >> 0x33 & 0xff) +
            ((ulong)local_1c8.Y.v[1]._4_1_ << 7 |
            (ulong)local_1c8.Y.v[1]._5_1_ << 0xf |
            (ulong)local_1c8.Y.v[1]._6_1_ << 0x17 |
            (ulong)local_1c8.Y.v[1]._7_1_ << 0x1f |
            (ulong)(byte)local_1c8.Y.v[2] << 0x27 | (ulong)local_1c8.Y.v[2]._1_1_ << 0x2f);
    (h->Y).v[0] = uVar8 & 0x7ffffffffffff;
    (h->Y).v[1] = uVar9 & 0x7ffffffffffff;
    (h->Y).v[2] = uVar6 & 0x7ffffffffffff;
    (h->Y).v[3] = uVar7 & 0x7ffffffffffff;
    (h->Y).v[4] = (uVar7 >> 0x33) +
                  ((ulong)local_1c8.Y.v[2]._2_1_ << 4 |
                  (ulong)local_1c8.Y.v[2]._3_1_ << 0xc |
                  (ulong)local_1c8.Y.v[2]._4_1_ << 0x14 |
                  (ulong)local_1c8.Y.v[2]._5_1_ << 0x1c |
                  (ulong)local_1c8.Y.v[2]._6_1_ << 0x24 | (ulong)local_1c8.Y.v[2]._7_1_ << 0x2c);
    uVar8 = ((ulong)(byte)local_1c8.Y.v[3] |
             (ulong)local_1c8.Y.v[3]._2_1_ << 0x10 |
             (ulong)local_1c8.Y.v[3]._3_1_ << 0x18 |
             (ulong)local_1c8.Y.v[3]._4_1_ << 0x20 | (ulong)local_1c8.Y.v[3]._5_1_ << 0x28 |
            (ulong)local_1c8.Y.v[3]._1_1_ << 8) + ((ulong)local_1c8.Y.v[3]._6_1_ << 0x30);
    uVar9 = (uVar8 >> 0x33) +
            ((ulong)local_1c8.Y.v[3]._7_1_ << 5 |
            (ulong)(byte)local_1c8.Y.v[4] << 0xd |
            (ulong)local_1c8.Y.v[4]._1_1_ << 0x15 |
            (ulong)local_1c8.Y.v[4]._2_1_ << 0x1d |
            (ulong)local_1c8.Y.v[4]._3_1_ << 0x25 | (ulong)local_1c8.Y.v[4]._4_1_ << 0x2d);
    uVar6 = ((ulong)local_1c8.Y.v[4]._6_1_ << 10 |
            (ulong)local_1c8.Y.v[4]._7_1_ << 0x12 |
            (ulong)(byte)local_1c8.Z.v[0] << 0x1a |
            (ulong)local_1c8.Z.v[0]._1_1_ << 0x22 |
            (ulong)local_1c8.Z.v[0]._2_1_ << 0x2a | (ulong)local_1c8.Z.v[0]._3_1_ << 0x32) +
            (ulong)local_1c8.Y.v[4]._5_1_ * 4 + (uVar9 >> 0x33);
    uVar7 = (uVar6 >> 0x33 & 0xff) +
            ((ulong)local_1c8.Z.v[0]._4_1_ << 7 |
            (ulong)local_1c8.Z.v[0]._5_1_ << 0xf |
            (ulong)local_1c8.Z.v[0]._6_1_ << 0x17 |
            (ulong)local_1c8.Z.v[0]._7_1_ << 0x1f |
            (ulong)(byte)local_1c8.Z.v[1] << 0x27 | (ulong)local_1c8.Z.v[1]._1_1_ << 0x2f);
    (h->Z).v[0] = uVar8 & 0x7ffffffffffff;
    (h->Z).v[1] = uVar9 & 0x7ffffffffffff;
    (h->Z).v[2] = uVar6 & 0x7ffffffffffff;
    (h->Z).v[3] = uVar7 & 0x7ffffffffffff;
    (h->Z).v[4] = (uVar7 >> 0x33) +
                  ((ulong)local_1c8.Z.v[1]._2_1_ << 4 |
                  (ulong)local_1c8.Z.v[1]._3_1_ << 0xc |
                  (ulong)local_1c8.Z.v[1]._4_1_ << 0x14 |
                  (ulong)local_1c8.Z.v[1]._5_1_ << 0x1c |
                  (ulong)local_1c8.Z.v[1]._6_1_ << 0x24 | (ulong)local_1c8.Z.v[1]._7_1_ << 0x2c);
    uVar8 = ((ulong)(byte)local_1c8.Z.v[2] |
             (ulong)local_1c8.Z.v[2]._2_1_ << 0x10 |
             (ulong)local_1c8.Z.v[2]._3_1_ << 0x18 |
             (ulong)local_1c8.Z.v[2]._4_1_ << 0x20 | (ulong)local_1c8.Z.v[2]._5_1_ << 0x28 |
            (ulong)local_1c8.Z.v[2]._1_1_ << 8) + ((ulong)local_1c8.Z.v[2]._6_1_ << 0x30);
    uVar9 = (uVar8 >> 0x33) +
            ((ulong)local_1c8.Z.v[2]._7_1_ << 5 |
            (ulong)(byte)local_1c8.Z.v[3] << 0xd |
            (ulong)local_1c8.Z.v[3]._1_1_ << 0x15 |
            (ulong)local_1c8.Z.v[3]._2_1_ << 0x1d |
            (ulong)local_1c8.Z.v[3]._3_1_ << 0x25 | (ulong)local_1c8.Z.v[3]._4_1_ << 0x2d);
    uVar6 = ((ulong)local_1c8.Z.v[3]._6_1_ << 10 |
            (ulong)local_1c8.Z.v[3]._7_1_ << 0x12 |
            (ulong)(byte)local_1c8.Z.v[4] << 0x1a |
            (ulong)local_1c8.Z.v[4]._1_1_ << 0x22 |
            (ulong)local_1c8.Z.v[4]._2_1_ << 0x2a | (ulong)local_1c8.Z.v[4]._3_1_ << 0x32) +
            (ulong)local_1c8.Z.v[3]._5_1_ * 4 + (uVar9 >> 0x33);
    uVar7 = (uVar6 >> 0x33 & 0xff) +
            ((ulong)local_1c8.Z.v[4]._4_1_ << 7 |
            (ulong)local_1c8.Z.v[4]._5_1_ << 0xf |
            (ulong)local_1c8.Z.v[4]._6_1_ << 0x17 |
            (ulong)local_1c8.Z.v[4]._7_1_ << 0x1f |
            (ulong)(byte)local_1c8.T.v[0] << 0x27 | (ulong)local_1c8.T.v[0]._1_1_ << 0x2f);
    (h->T).v[0] = uVar8 & 0x7ffffffffffff;
    (h->T).v[1] = uVar9 & 0x7ffffffffffff;
    (h->T).v[2] = uVar6 & 0x7ffffffffffff;
    (h->T).v[3] = uVar7 & 0x7ffffffffffff;
    (h->T).v[4] = (uVar7 >> 0x33) +
                  ((ulong)local_1c8.T.v[0]._2_1_ << 4 |
                  (ulong)local_1c8.T.v[0]._3_1_ << 0xc |
                  (ulong)local_1c8.T.v[0]._4_1_ << 0x14 |
                  (ulong)local_1c8.T.v[0]._5_1_ << 0x1c |
                  (ulong)local_1c8.T.v[0]._6_1_ << 0x24 | (ulong)local_1c8.T.v[0]._7_1_ << 0x2c);
  }
  else {
    lVar3 = 0;
    do {
      bVar1 = a[lVar3];
      abStack_208[lVar3 * 2] = bVar1 & 0xf;
      abStack_208[lVar3 * 2 + 1] = bVar1 >> 4;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x20);
    lVar3 = 0;
    cVar4 = '\0';
    do {
      cVar5 = cVar4 + abStack_208[lVar3];
      bVar1 = cVar5 + 8;
      cVar4 = (char)bVar1 >> 4;
      abStack_208[lVar3] = cVar5 - (bVar1 & 0xf0);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x3f);
    abStack_208[0x3f] = abStack_208[0x3f] + cVar4;
    (h->X).v[4] = 0;
    (h->Y).v[0] = 0;
    (h->Y).v[3] = 0;
    (h->Y).v[4] = 0;
    (h->Y).v[1] = 0;
    (h->Y).v[2] = 0;
    (h->X).v[2] = 0;
    (h->X).v[3] = 0;
    (h->X).v[0] = 0;
    (h->X).v[1] = 0;
    (h->Y).v[0] = 1;
    (h->Z).v[0] = 0;
    (h->Z).v[1] = 0;
    (h->Z).v[2] = 0;
    (h->Z).v[3] = 0;
    iVar10 = 0;
    (h->Z).v[4] = 0;
    (h->Z).v[0] = 1;
    (h->T).v[0] = 0;
    (h->T).v[1] = 0;
    (h->T).v[2] = 0;
    (h->T).v[3] = 0;
    (h->T).v[4] = 0;
    uVar6 = 0xffffffffffffffff;
    do {
      table_select(&local_a8,iVar10,abStack_208[uVar6 + 2]);
      ge_madd((ge_p1p1 *)(abStack_208 + 0x40),h,&local_a8);
      x25519_ge_p1p1_to_p3(h,(ge_p1p1 *)(abStack_208 + 0x40));
      uVar6 = uVar6 + 2;
      iVar10 = iVar10 + 1;
    } while (uVar6 < 0x3e);
    local_128.X.v[4] = (h->X).v[4];
    local_128.X.v[0] = (h->X).v[0];
    local_128.X.v[1] = (h->X).v[1];
    local_128.X.v[2] = (h->X).v[2];
    local_128.X.v[3] = (h->X).v[3];
    local_128.Y.v[0] = (h->Y).v[0];
    local_128.Y.v[1] = (h->Y).v[1];
    local_128.Y.v[2] = (h->Y).v[2];
    local_128.Y.v[3] = (h->Y).v[3];
    local_128.Y.v[4] = (h->Y).v[4];
    local_128.Z.v[0] = (h->Z).v[0];
    local_128.Z.v[1] = (h->Z).v[1];
    local_128.Z.v[2] = (h->Z).v[2];
    local_128.Z.v[3] = (h->Z).v[3];
    local_128.Z.v[4] = (h->Z).v[4];
    r_00 = (ge_p1p1 *)(abStack_208 + 0x40);
    ge_p2_dbl(r_00,&local_128);
    x25519_ge_p1p1_to_p2(&local_128,r_00);
    ge_p2_dbl(r_00,&local_128);
    x25519_ge_p1p1_to_p2(&local_128,r_00);
    ge_p2_dbl(r_00,&local_128);
    x25519_ge_p1p1_to_p2(&local_128,r_00);
    ge_p2_dbl(r_00,&local_128);
    x25519_ge_p1p1_to_p3(h,r_00);
    uVar6 = 0xfffffffffffffffe;
    iVar10 = 0;
    do {
      table_select(&local_a8,iVar10,abStack_208[uVar6 + 2]);
      ge_madd(r_00,h,&local_a8);
      x25519_ge_p1p1_to_p3(h,r_00);
      uVar6 = uVar6 + 2;
      iVar10 = iVar10 + 1;
    } while (uVar6 < 0x3e);
  }
  return;
}

Assistant:

void x25519_ge_scalarmult_base(ge_p3 *h, const uint8_t a[32]) {
#if defined(BORINGSSL_FE25519_ADX)
  if (CRYPTO_is_BMI1_capable() && CRYPTO_is_BMI2_capable() &&
      CRYPTO_is_ADX_capable()) {
    uint8_t t[4][32];
    x25519_ge_scalarmult_base_adx(t, a);
    fiat_25519_from_bytes(h->X.v, t[0]);
    fiat_25519_from_bytes(h->Y.v, t[1]);
    fiat_25519_from_bytes(h->Z.v, t[2]);
    fiat_25519_from_bytes(h->T.v, t[3]);
    return;
  }
#endif
  signed char e[64];
  signed char carry;
  ge_p1p1 r;
  ge_p2 s;
  ge_precomp t;
  int i;

  for (i = 0; i < 32; ++i) {
    e[2 * i + 0] = (a[i] >> 0) & 15;
    e[2 * i + 1] = (a[i] >> 4) & 15;
  }
  // each e[i] is between 0 and 15
  // e[63] is between 0 and 7

  carry = 0;
  for (i = 0; i < 63; ++i) {
    e[i] += carry;
    carry = e[i] + 8;
    carry >>= 4;
    e[i] -= carry << 4;
  }
  e[63] += carry;
  // each e[i] is between -8 and 8

  ge_p3_0(h);
  for (i = 1; i < 64; i += 2) {
    table_select(&t, i / 2, e[i]);
    ge_madd(&r, h, &t);
    x25519_ge_p1p1_to_p3(h, &r);
  }

  ge_p3_dbl(&r, h);
  x25519_ge_p1p1_to_p2(&s, &r);
  ge_p2_dbl(&r, &s);
  x25519_ge_p1p1_to_p2(&s, &r);
  ge_p2_dbl(&r, &s);
  x25519_ge_p1p1_to_p2(&s, &r);
  ge_p2_dbl(&r, &s);
  x25519_ge_p1p1_to_p3(h, &r);

  for (i = 0; i < 64; i += 2) {
    table_select(&t, i / 2, e[i]);
    ge_madd(&r, h, &t);
    x25519_ge_p1p1_to_p3(h, &r);
  }
}